

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O1

void __thiscall QFunctionJAOHTree::ComputeQ(QFunctionJAOHTree *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  PlanningUnitMADPDiscrete *pPVar4;
  JointBeliefInterface *pJVar5;
  long *plVar6;
  size_type __n;
  BayesianGameIdenticalPayoff *this_00;
  size_t sVar7;
  long lVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  ulong uVar9;
  E *this_01;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BGIP_sharedPtr bg_time_step;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  shared_ptr<BayesianGameIdenticalPayoff> local_1a8;
  ulong local_198;
  ulong local_190;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> local_160;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
  lVar3 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0
                                + lVar3) + 0x60))
                    (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3);
  if (lVar3 != 0) {
    lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    pPVar4 = (PlanningUnitMADPDiscrete *)
             (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                     field_0x0 + lVar3) + 0x60))
                       (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3)
    ;
    pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(pPVar4);
    lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    lVar3 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                    field_0x0 + lVar3) + 0x60))
                      (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3);
    lVar3 = *(long *)(lVar3 + 0x18);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    plVar6 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOH).
                                             super_QFunctionJAOHInterface.field_0x0 + lVar8) + 0x60)
                     )(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    __n = (**(code **)(*plVar6 + 0x30))(plVar6);
    local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_178,__n,(value_type_conflict2 *)&local_160,(allocator_type *)&local_1a8);
    this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    plVar6 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOH).
                                             super_QFunctionJAOHInterface.field_0x0 + lVar8) + 0x60)
                     )(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    sVar7 = (**(code **)(*plVar6 + 0x30))(plVar6);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                    field_0x0 + lVar8) + 0x60))
                      (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(lVar8 + 0x30) + 0x58))();
    BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
              (this_00,sVar7,nrActions,&local_178,false);
    boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
              (&local_1a8,this_00);
    local_188.px = (element_type *)0x3ff0000000000000;
    if (((local_1a8.px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        _m_useSparse == true) {
      local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver =
           (_func_int **)
           &((local_1a8.px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            _m_jTypeProbsSparse;
      local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver._m_referredBG.px
           = (element_type *)0x0;
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             *)&local_160,(value_type *)&local_188);
    }
    else {
      *((local_1a8.px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
       _m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    uVar11 = 0;
    while( true ) {
      lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
      lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                      field_0x0 + lVar8) + 0x60))
                        (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8
                        );
      uVar9 = (**(code **)(**(long **)(lVar8 + 0x30) + 0x68))();
      uVar12 = (ulong)uVar11;
      if (uVar9 <= uVar12) break;
      uVar10 = 0;
      local_190 = 0;
      while( true ) {
        lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
        pPVar4 = (PlanningUnitMADPDiscrete *)
                 (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                         field_0x0 + lVar8) + 0x60))
                           (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 +
                            lVar8);
        sVar7 = PlanningUnitMADPDiscrete::GetNrStates(pPVar4);
        if (sVar7 <= uVar10) break;
        local_198 = (**(code **)(*(long *)(&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8)) +
                                0x48))(&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8),
                                       (ulong)uVar10);
        lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
        lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                        field_0x0 + lVar8) + 0x60))
                          (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 +
                           lVar8);
        auVar13._0_8_ =
             (**(code **)(**(long **)(lVar8 + 0x330) + 0xc0))
                       (*(long **)(lVar8 + 0x330),uVar10,uVar12);
        auVar13._8_56_ = extraout_var;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_190;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_198;
        auVar2 = vfmadd231sd_fma(auVar15,auVar13._0_16_,auVar1);
        local_190 = auVar2._0_8_;
        uVar10 = uVar10 + 1;
      }
      uVar9 = 0;
      if (lVar3 != 1) {
        uVar9 = (**(code **)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + 0x78))
                          (this,1,0,uVar12);
      }
      lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
      local_198 = uVar9;
      lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                      field_0x0 + lVar8) + 0x60))
                        (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8
                        );
      plVar6 = *(long **)(lVar8 + 0x330);
      auVar14._0_8_ =
           (**(code **)(*(long *)((long)plVar6 + *(long *)(*plVar6 + -0xb0)) + 0x70))
                     ((long)plVar6 + *(long *)(*plVar6 + -0xb0));
      auVar14._8_56_ = extraout_var_00;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_198;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_190;
      auVar2 = vfmadd213sd_fma(auVar16,auVar14._0_16_,auVar2);
      (this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.data_[uVar12] = auVar2._0_8_;
      (*((local_1a8.px)->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                (auVar2._0_8_,(local_1a8.px)->_m_utilFunction,0,uVar12);
      uVar11 = uVar11 + 1;
    }
    local_188.px = &(local_1a8.px)->super_BayesianGameIdenticalPayoffInterface;
    local_188.pn.pi_ = local_1a8.pn.pi_;
    if (local_1a8.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1a8.pn.pi_)->use_count_ = (local_1a8.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
              ((BayesianGameIdenticalPayoffSolver *)&local_160,&local_188,0x7fffffff);
    local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface._m_nrSolutionsReturned = 0;
    local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_0059cd00;
    local_160._m_verbosity = 0;
    local_160._m_deadlineInSeconds = 0;
    local_160._m_solved = false;
    local_160._m_CBGupperBound = 1.79769313486232e+308;
    boost::detail::shared_count::~shared_count(&local_188.pn);
    BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve(&local_160);
    if (pJVar5 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*pJVar5 + 8))(pJVar5);
    }
    local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_0059e988;
    BGIPSolution::~BGIPSolution
              (&local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                _m_solution);
    boost::detail::shared_count::~shared_count
              (&local_160.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                _m_referredBG.pn);
    boost::detail::shared_count::~shared_count(&local_1a8.pn);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,"QFunctionJAOHTree::ComputeQ - GetPU() returns 0; no PlanningUnit available!");
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void QFunctionJAOHTree::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QFunctionJAOHTree::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
#if QFunctionJAOH_useIndices
#else    
    JointActionObservationHistoryTree* root = GetPU()->
        GetJointActionObservationHistoryTree(Globals::INITIAL_JAOHI);
#endif
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step + 1) == GetPU()->GetHorizon()) //unlikely, but possible
        last_t = true;

    if(DEBUG_QHEUR_COMP_TREE){cout << "QFunctionJAOHTree::Compute() called" << endl;}

    //in the first time_step t=0, there is no previous action and there is only
    //the empty observation action history.
    //Therefore we're going to construct a Bayesian game where there is only 1
    //type for each agent.
    vector<size_t> nrTypes = vector<size_t>(GetPU()->GetNrAgents(), 1);
    BGIP_sharedPtr bg_time_step=BGIP_sharedPtr(
        new BayesianGameIdenticalPayoff(GetPU()->GetNrAgents(), 
                                        GetPU()->GetNrActions(),
                                        nrTypes));

    size_t empty_jaohI = 0;
    bg_time_step->SetProbability(empty_jaohI, 1.0);
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        //calculate R(joah',newJA) - expected immediate reward for time_step
        double exp_imm_R = 0.0;
#if USE_BeliefIteratorGeneric
        BeliefIteratorGeneric it=b0.GetIterator();
        do exp_imm_R += it.GetProbability() *
            GetPU()->GetReward(it.GetStateIndex(), newJAI);
        while (it.Next());
#else
        for(Index sI=0; sI < GetPU()->GetNrStates(); sI++)
            exp_imm_R += (b0.Get(sI)) * GetPU()->GetReward(sI, newJAI);
#endif        
        //calculate Q(jaoh', newJA) =  R(joah',newJA) + exp. future R
        //  and the exp. future R = ComputeRecursively(t+1, root, newJA)
        double exp_fut_R = 0.0;
        if(!last_t)
#if QFunctionJAOH_useIndices
            exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);
#else    
            exp_fut_R = ComputeRecursively( 1, root, newJAI);
#endif
        double Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        _m_QValues(empty_jaohI,newJAI)=Q;
        bg_time_step->SetUtility(empty_jaohI, newJAI, Q);
    }//end for newJAI
    if(DEBUG_QHEUR_COMP_TREE)
    {
        cout << "QFunctionJAOHTree::ComputeQ() for..."<<endl<<
            " time_step=0  called, with ISD=";
        b0.Print();
        cout <<endl;
        bg_time_step->Print();
    }
    //solve this bayesian game
    BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step);
    double v = bgs.Solve();
    if(DEBUG_QHEUR_COMP_TREE)
        cout << "QFunctionJAOHTree::ComputeQ() - Expected V(b0) = " << v << endl<< endl;
    delete b0p;
    return;
}